

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  uint *puVar1;
  double a;
  int _j;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined4 uVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  pointer pnVar7;
  pointer pnVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  int *piVar13;
  element_type *peVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined5 uVar30;
  undefined3 uVar31;
  undefined5 uVar32;
  undefined3 uVar33;
  char cVar34;
  int iVar35;
  bool bVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  RowSingletonPS *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar40;
  cpp_dec_float<50U,_int,_void> *pcVar41;
  bool bVar42;
  long in_FS_OFFSET;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  fpclass_type local_848;
  bool local_840;
  fpclass_type local_838;
  element_type *local_7f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7f0;
  uint local_7e8 [3];
  undefined3 uStack_7db;
  uint local_7d8;
  undefined3 uStack_7d3;
  int local_7d0;
  char local_7cc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c8;
  element_type *local_7b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7b0;
  uint local_7a8 [3];
  undefined3 uStack_79b;
  uint local_798;
  undefined3 uStack_793;
  int local_790;
  char local_78c;
  undefined8 local_788;
  undefined1 local_778 [16];
  element_type *local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_760;
  uint local_758 [2];
  uint auStack_750 [2];
  uint local_748 [2];
  int local_740;
  bool local_73c;
  fpclass_type local_738;
  int32_t iStack_734;
  shared_ptr<soplex::Tolerances> local_728;
  undefined1 local_718 [8];
  undefined8 uStack_710;
  uint local_708 [3];
  undefined3 uStack_6fb;
  uint local_6f8;
  undefined3 uStack_6f3;
  int local_6f0;
  bool local_6ec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e8;
  fpclass_type local_6e0;
  int32_t iStack_6dc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  fpclass_type local_478;
  int32_t iStack_474;
  undefined8 uStack_470;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  cpp_dec_float<50U,_int,_void> local_3b0;
  cpp_dec_float<50U,_int,_void> local_378;
  cpp_dec_float<50U,_int,_void> local_340;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2d0;
  undefined1 local_298 [40];
  int local_270;
  bool local_26c;
  fpclass_type local_268;
  int32_t iStack_264;
  cpp_dec_float<50U,_int,_void> local_258;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined5 uStack_200;
  undefined3 uStack_1fb;
  undefined5 uStack_1f8;
  undefined8 uStack_1f3;
  undefined8 local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined5 uStack_180;
  undefined3 uStack_17b;
  undefined5 uStack_178;
  undefined8 uStack_173;
  undefined8 local_168;
  element_type *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [2];
  int local_130;
  bool local_12c;
  fpclass_type local_128;
  int32_t iStack_124;
  cpp_dec_float<50U,_int,_void> local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pNVar6 = row->m_elem;
  local_748 = *(uint (*) [2])((pNVar6->val).m_backend.data._M_elems + 8);
  local_768 = *(element_type **)(pNVar6->val).m_backend.data._M_elems;
  p_Stack_760 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((pNVar6->val).m_backend.data._M_elems + 2);
  local_758 = *(uint (*) [2])((pNVar6->val).m_backend.data._M_elems + 4);
  auStack_750 = *(uint (*) [2])((pNVar6->val).m_backend.data._M_elems + 6);
  local_740 = (pNVar6->val).m_backend.exp;
  local_73c = (pNVar6->val).m_backend.neg;
  local_738 = (pNVar6->val).m_backend.fpclass;
  iStack_734 = (pNVar6->val).m_backend.prec_elem;
  _j = pNVar6->idx;
  lVar39 = (long)_j;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  local_778._0_8_ = -a;
  local_778._8_4_ = 0;
  local_778._12_4_ = 0x80000000;
  local_788._0_4_ = cpp_dec_float_finite;
  local_788._4_4_ = 10;
  local_7b8 = (element_type *)0x0;
  p_Stack_7b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7a8[0] = 0;
  local_7a8[1] = 0;
  stack0xfffffffffffff860 = 0;
  uStack_79b = 0;
  _local_798 = 0;
  uStack_793 = 0;
  local_790 = 0;
  local_78c = '\0';
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_7b8,(double)local_778._0_8_);
  ::soplex::infinity::__tls_init();
  local_7c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0xa00000000;
  local_7f8 = (element_type *)0x0;
  p_Stack_7f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7e8[0] = 0;
  local_7e8[1] = 0;
  stack0xfffffffffffff820 = 0;
  uStack_7db = 0;
  _local_7d8 = 0;
  uStack_7d3 = 0;
  local_7d0 = 0;
  local_7cc = '\0';
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_7f8,a);
  uVar9 = _local_738;
  p_Var15 = p_Stack_760;
  peVar14 = local_768;
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_118,0.0);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_2d0,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var15;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_118);
  local_848 = (fpclass_type)uVar9;
  if (((local_848 == cpp_dec_float_NaN) || (local_2d0.fpclass == cpp_dec_float_NaN)) ||
     (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_2d0), iVar37 < 1)) {
    local_138[0] = local_748[0];
    local_138[1] = local_748[1];
    local_148[0] = local_758[0];
    local_148[1] = local_758[1];
    auStack_140[0] = auStack_750[0];
    auStack_140[1] = auStack_750[1];
    local_158 = local_768;
    p_Stack_150 = p_Stack_760;
    local_130 = local_740;
    local_12c = local_73c;
    local_128 = local_738;
    iStack_124 = iStack_734;
    local_168 = 0xa00000000;
    local_198 = 0;
    uStack_190 = 0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_17b = 0;
    uStack_178 = 0;
    uStack_173 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_198,0.0);
    epsZero(&local_68,this);
    bVar36 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_158,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_198,&local_68);
    if (!bVar36) {
      iVar37 = *i;
      pnVar7 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1d8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar7[iVar37].m_backend.data._M_elems + 8);
      local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[iVar37].m_backend.data;
      local_1d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar7[iVar37].m_backend.data._M_elems + 2);
      puVar1 = pnVar7[iVar37].m_backend.data._M_elems + 4;
      local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1d8.m_backend.exp = pnVar7[iVar37].m_backend.exp;
      local_1d8.m_backend.neg = pnVar7[iVar37].m_backend.neg;
      local_1d8.m_backend.fpclass = pnVar7[iVar37].m_backend.fpclass;
      local_1d8.m_backend.prec_elem = pnVar7[iVar37].m_backend.prec_elem;
      local_1e8 = 0xa00000000;
      local_218 = 0;
      uStack_210 = 0;
      local_208 = 0;
      uStack_200 = 0;
      uStack_1fb = 0;
      uStack_1f8 = 0;
      uStack_1f3 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_218,0.0);
      feastol(&local_a0,this);
      bVar36 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1d8,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_218,&local_a0);
      if (bVar36) {
        return INFEASIBLE;
      }
      pnVar8 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar7 = pnVar8 + *i;
      peVar14 = *(element_type **)&(pnVar7->m_backend).data;
      p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((pnVar7->m_backend).data._M_elems + 2);
      uVar5 = pnVar8[*i].m_backend.fpclass;
      local_258.fpclass = cpp_dec_float_finite;
      local_258.prec_elem = 10;
      local_258.data._M_elems[0] = 0;
      local_258.data._M_elems[1] = 0;
      local_258.data._M_elems[2] = 0;
      local_258.data._M_elems[3] = 0;
      local_258.data._M_elems[4] = 0;
      local_258.data._M_elems[5] = 0;
      local_258.data._M_elems._24_5_ = 0;
      local_258.data._M_elems[7]._1_3_ = 0;
      local_258.data._M_elems._32_5_ = 0;
      local_258._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_258,0.0);
      feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_308,this);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar14;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var15;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_258);
      if (((uVar5 != cpp_dec_float_NaN) && (local_308.fpclass != cpp_dec_float_NaN)) &&
         (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_308), 0 < iVar37)) {
        return INFEASIBLE;
      }
      goto LAB_002f36d8;
    }
    pcVar41 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_6e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0xa00000000;
    local_718._0_4_ = 0;
    local_718._4_4_ = 0;
    uStack_710._0_4_ = 0;
    uStack_710._4_4_ = 0;
    local_708[0] = 0;
    local_708[1] = 0;
    stack0xfffffffffffff900 = 0;
    uStack_6fb = 0;
    _local_6f8 = 0;
    uStack_6f3 = 0;
    local_6f0 = 0;
    local_6ec = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_718,a);
    if (((pcVar41->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_6e8 == cpp_dec_float_NaN))
       || (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar41,(cpp_dec_float<50U,_int,_void> *)local_718), iVar37 < 0)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,
                 (cpp_dec_float<50U,_int,_void> *)&local_768);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_778._0_8_);
    }
    _local_798 = 0;
    uStack_793 = 0;
    local_7a8[0] = 0;
    local_7a8[1] = 0;
    stack0xfffffffffffff860 = 0;
    uStack_79b = 0;
    local_7b8 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    p_Stack_7b0 = ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_790 = 0;
    local_78c = '\0';
    local_788._0_4_ = cpp_dec_float_finite;
    local_788._4_4_ = 10;
    pcVar41 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_6e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0xa00000000;
    local_718._0_4_ = 0;
    local_718._4_4_ = 0;
    uStack_710._0_4_ = 0;
    uStack_710._4_4_ = 0;
    local_708[0] = 0;
    local_708[1] = 0;
    stack0xfffffffffffff900 = 0;
    uStack_6fb = 0;
    _local_6f8 = 0;
    uStack_6f3 = 0;
    local_6f0 = 0;
    local_6ec = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_718,(double)local_778._0_8_);
    if (((pcVar41->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_6e8 == cpp_dec_float_NaN))
       || (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar41,(cpp_dec_float<50U,_int,_void> *)local_718), 0 < iVar37)) {
      pcVar41 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_002f3631;
    }
LAB_002f3668:
    ::soplex::infinity::__tls_init();
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,a);
  }
  else {
    pcVar41 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_6e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0xa00000000;
    local_718._0_4_ = 0;
    local_718._4_4_ = 0;
    uStack_710._0_4_ = 0;
    uStack_710._4_4_ = 0;
    local_708[0] = 0;
    local_708[1] = 0;
    stack0xfffffffffffff900 = 0;
    uStack_6fb = 0;
    _local_6f8 = 0;
    uStack_6f3 = 0;
    local_6f0 = 0;
    local_6ec = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_718,(double)local_778._0_8_);
    if (((pcVar41->fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_6e8 == cpp_dec_float_NaN))
       || (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar41,(cpp_dec_float<50U,_int,_void> *)local_718), 0 < iVar37)) {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,
                 (cpp_dec_float<50U,_int,_void> *)&local_768);
    }
    else {
      ::soplex::infinity::__tls_init();
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_778._0_8_);
    }
    _local_798 = 0;
    uStack_793 = 0;
    local_7a8[0] = 0;
    local_7a8[1] = 0;
    stack0xfffffffffffff860 = 0;
    uStack_79b = 0;
    local_7b8 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    p_Stack_7b0 = ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_790 = 0;
    local_78c = '\0';
    local_788._0_4_ = cpp_dec_float_finite;
    local_788._4_4_ = 10;
    pcVar41 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
    ::soplex::infinity::__tls_init();
    local_6e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0xa00000000;
    local_718._0_4_ = 0;
    local_718._4_4_ = 0;
    uStack_710._0_4_ = 0;
    uStack_710._4_4_ = 0;
    local_708[0] = 0;
    local_708[1] = 0;
    stack0xfffffffffffff900 = 0;
    uStack_6fb = 0;
    _local_6f8 = 0;
    uStack_6f3 = 0;
    local_6f0 = 0;
    local_6ec = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_718,a);
    if (((pcVar41->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_6e8 != cpp_dec_float_NaN))
       && (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar41,(cpp_dec_float<50U,_int,_void> *)local_718), -1 < iVar37))
    goto LAB_002f3668;
    pcVar41 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_002f3631:
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)&ptr,pcVar41,
               (cpp_dec_float<50U,_int,_void> *)&local_768);
  }
  _local_7d8 = 0;
  uStack_7d3 = 0;
  local_7e8[0] = 0;
  local_7e8[1] = 0;
  stack0xfffffffffffff820 = 0;
  uStack_7db = 0;
  local_7f8 = ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Stack_7f0 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_7d0 = 0;
  local_7cc = '\0';
  local_7c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0xa00000000;
LAB_002f36d8:
  uVar9 = local_788;
  p_Var15 = p_Stack_7b0;
  peVar14 = local_7b8;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_340,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var15;
  local_838 = (fpclass_type)uVar9;
  if (((local_838 != cpp_dec_float_NaN) && (local_340.fpclass != cpp_dec_float_NaN)) &&
     (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_340), iVar37 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_7b8,0.0);
  }
  pnVar12 = local_7c8;
  p_Var15 = p_Stack_7f0;
  peVar14 = local_7f8;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_378,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var15;
  local_838 = (fpclass_type)pnVar12;
  if (((local_838 != 2) && (local_378.fpclass != cpp_dec_float_NaN)) &&
     (iVar37 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_378), iVar37 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_7f8,0.0);
  }
  pnVar12 = local_7c8;
  cVar34 = local_7cc;
  iVar38 = local_7d0;
  uVar33 = uStack_7d3;
  uVar32 = _local_7d8;
  uVar31 = uStack_7db;
  uVar30 = stack0xfffffffffffff820;
  uVar28 = local_7e8._0_8_;
  p_Var15 = p_Stack_7f0;
  peVar14 = local_7f8;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 8);
  uVar16 = *(undefined8 *)&pnVar7[lVar39].m_backend.data;
  uVar17 = *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar7[lVar39].m_backend.data._M_elems + 4;
  uVar18 = *(undefined8 *)puVar1;
  uVar19 = *(undefined8 *)(puVar1 + 2);
  iVar37 = pnVar7[lVar39].m_backend.exp;
  local_778[0] = pnVar7[lVar39].m_backend.neg;
  local_478 = pnVar7[lVar39].m_backend.fpclass;
  iStack_474 = pnVar7[lVar39].m_backend.prec_elem;
  uStack_470 = 0;
  uVar10 = *(undefined8 *)(pnVar8[lVar39].m_backend.data._M_elems + 8);
  uVar20 = *(undefined8 *)&pnVar8[lVar39].m_backend.data;
  uVar21 = *(undefined8 *)(pnVar8[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar8[lVar39].m_backend.data._M_elems + 4;
  uVar22 = *(undefined8 *)puVar1;
  uVar23 = *(undefined8 *)(puVar1 + 2);
  iVar2 = pnVar8[lVar39].m_backend.exp;
  bVar36 = pnVar8[lVar39].m_backend.neg;
  fVar3 = pnVar8[lVar39].m_backend.fpclass;
  iVar4 = pnVar8[lVar39].m_backend.prec_elem;
  uVar24 = *(undefined8 *)&pnVar8[lVar39].m_backend.data;
  uVar25 = *(undefined8 *)(pnVar8[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar8[lVar39].m_backend.data._M_elems + 4;
  uVar26 = *(undefined8 *)puVar1;
  uVar27 = *(undefined8 *)(puVar1 + 2);
  uVar11 = *(undefined8 *)(pnVar8[lVar39].m_backend.data._M_elems + 8);
  pnVar40 = local_7c8;
  feastol(&local_d8,this);
  uVar29 = local_7e8._0_8_;
  local_718 = (undefined1  [8])peVar14;
  uStack_710 = p_Var15;
  local_7e8[0] = (uint)uVar28;
  local_7e8[1] = SUB84(uVar28,4);
  local_708[0] = local_7e8[0];
  local_708[1] = local_7e8[1];
  stack0xfffffffffffff900 = uVar30;
  uStack_6fb = uVar31;
  _local_6f8 = uVar32;
  uStack_6f3 = uVar33;
  local_6f0 = iVar38;
  local_6ec = (bool)cVar34;
  local_6e8 = pnVar12;
  iStack_264 = iVar4;
  local_268 = fVar3;
  local_7e8._0_8_ = uVar29;
  local_298._0_8_ = uVar24;
  local_298._8_8_ = uVar25;
  local_298._16_8_ = uVar26;
  local_298._24_8_ = uVar27;
  local_298._32_8_ = uVar11;
  local_270 = iVar2;
  local_26c = bVar36;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)local_718,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_298,pnVar40);
  result_6.m_backend.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
  result_6.m_backend.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
  uVar11 = result_6.m_backend.data._M_elems._0_8_;
  result_6.m_backend.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
  result_6.m_backend.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
  result_6.m_backend.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
  result_6.m_backend.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
  result_6.m_backend.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
  result_6.m_backend.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
  result_6.m_backend.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
  result_6.m_backend.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
  result_6.m_backend.exp = local_d8.m_backend.exp;
  result_6.m_backend.neg = local_d8.m_backend.neg;
  result_6.m_backend.fpclass = local_d8.m_backend.fpclass;
  result_6.m_backend.prec_elem = local_d8.m_backend.prec_elem;
  result_6.m_backend.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
  if (result_6.m_backend.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite
     ) {
    result_6.m_backend.neg = (bool)(local_d8.m_backend.neg ^ 1);
  }
  result_6.m_backend.data._M_elems._0_8_ = uVar11;
  if ((local_d8.m_backend.fpclass == cpp_dec_float_NaN) || (local_838 == 2)) {
    local_840 = false;
  }
  else {
    iVar38 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_6.m_backend);
    if (iVar38 < 1) {
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,lVar39,&local_7f8,0);
      local_840 = true;
    }
    else {
      local_840 = false;
    }
  }
  uVar29 = local_788;
  cVar34 = local_78c;
  iVar35 = local_790;
  uVar33 = uStack_793;
  uVar32 = _local_798;
  uVar31 = uStack_79b;
  uVar30 = stack0xfffffffffffff860;
  uVar27 = local_7a8._0_8_;
  p_Var15 = p_Stack_7b0;
  peVar14 = local_7b8;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              **)(pnVar7[lVar39].m_backend.data._M_elems + 8);
  uVar11 = *(undefined8 *)&pnVar7[lVar39].m_backend.data;
  uVar24 = *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar7[lVar39].m_backend.data._M_elems + 4;
  uVar25 = *(undefined8 *)puVar1;
  uVar26 = *(undefined8 *)(puVar1 + 2);
  iVar38 = pnVar7[lVar39].m_backend.exp;
  bVar42 = pnVar7[lVar39].m_backend.neg;
  local_6e0 = pnVar7[lVar39].m_backend.fpclass;
  iStack_6dc = pnVar7[lVar39].m_backend.prec_elem;
  pnVar40 = pnVar12;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_3b0,this);
  uVar28 = local_7a8._0_8_;
  local_718 = (undefined1  [8])peVar14;
  uStack_710 = p_Var15;
  local_7a8[0] = (uint)uVar27;
  local_7a8[1] = SUB84(uVar27,4);
  local_708[0] = local_7a8[0];
  local_708[1] = local_7a8[1];
  stack0xfffffffffffff900 = uVar30;
  uStack_6fb = uVar31;
  _local_6f8 = uVar32;
  uStack_6f3 = uVar33;
  local_6f0 = iVar35;
  local_6ec = (bool)cVar34;
  local_6e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)uVar29;
  local_268 = local_6e0;
  iStack_264 = iStack_6dc;
  local_7a8._0_8_ = uVar28;
  local_298._0_8_ = uVar11;
  local_298._8_8_ = uVar24;
  local_298._16_8_ = uVar25;
  local_298._24_8_ = uVar26;
  local_298._32_8_ = pnVar12;
  local_270 = iVar38;
  local_26c = bVar42;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&ptr,(soplex *)local_718,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_298,pnVar40);
  if (((local_838 == 2) || (local_3b0.fpclass == cpp_dec_float_NaN)) ||
     (iVar38 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_3b0), iVar38 < 1)) {
    bVar42 = false;
  }
  else {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar39,&local_7b8,0);
    bVar42 = true;
  }
  this_00 = (RowSingletonPS *)operator_new(0x218);
  iVar38 = *i;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_3e8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 8);
  local_3e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[lVar39].m_backend.data;
  local_3e8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar7[lVar39].m_backend.data._M_elems + 4;
  local_3e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_3e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_3e8.m_backend.exp = pnVar7[lVar39].m_backend.exp;
  local_3e8.m_backend.neg = pnVar7[lVar39].m_backend.neg;
  local_3e8.m_backend.fpclass = pnVar7[lVar39].m_backend.fpclass;
  local_3e8.m_backend.prec_elem = pnVar7[lVar39].m_backend.prec_elem;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_428.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[lVar39].m_backend.data;
  local_428.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 2);
  puVar1 = pnVar7[lVar39].m_backend.data._M_elems + 4;
  local_428.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_428.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_428.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar7[lVar39].m_backend.data._M_elems + 8);
  local_428.m_backend.exp = pnVar7[lVar39].m_backend.exp;
  local_428.m_backend.neg = pnVar7[lVar39].m_backend.neg;
  local_428.m_backend.fpclass = pnVar7[lVar39].m_backend.fpclass;
  local_428.m_backend.prec_elem = pnVar7[lVar39].m_backend.prec_elem;
  local_468.m_backend.neg = (bool)local_778[0];
  local_468.m_backend.fpclass = local_478;
  local_468.m_backend.prec_elem = iStack_474;
  local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_4b8.m_backend.data._M_elems._0_8_ = uVar20;
  local_4b8.m_backend.data._M_elems._8_8_ = uVar21;
  local_4b8.m_backend.data._M_elems._16_8_ = uVar22;
  local_4b8.m_backend.data._M_elems._24_8_ = uVar23;
  local_4b8.m_backend.data._M_elems._32_8_ = uVar10;
  local_4b8.m_backend.exp = iVar2;
  local_4b8.m_backend.neg = bVar36;
  local_4b8.m_backend.fpclass = fVar3;
  local_4b8.m_backend.prec_elem = iVar4;
  local_468.m_backend.data._M_elems._0_8_ = uVar16;
  local_468.m_backend.data._M_elems._8_8_ = uVar17;
  local_468.m_backend.data._M_elems._16_8_ = uVar18;
  local_468.m_backend.data._M_elems._24_8_ = uVar19;
  local_468.m_backend.data._M_elems._32_8_ = uVar9;
  local_468.m_backend.exp = iVar37;
  RowSingletonPS::RowSingletonPS
            (this_00,lp,iVar38,_j,bVar42,local_840,&local_3e8,&local_428,&local_468,&local_4b8,
             &local_728);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_728.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar13 = (this->m_rIdx).data;
  piVar13[*i] = piVar13[(long)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(lp);
  piVar13 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remRows;
  *piVar13 = *piVar13 + 1;
  piVar13 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar13 = *piVar13 + 1;
  piVar13 = (this->m_stat).data + 2;
  *piVar13 = *piVar13 + 1;
  if (ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}